

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O3

void av1_setup_xform(AV1_COMMON *cm,MACROBLOCK *x,TX_SIZE tx_size,TX_TYPE tx_type,
                    TxfmParam *txfm_param)

{
  MB_MODE_INFO *pMVar1;
  uint uVar2;
  ulong uVar3;
  
  pMVar1 = *(x->e_mbd).mi;
  txfm_param->tx_type = tx_type;
  txfm_param->tx_size = tx_size;
  txfm_param->lossless = (x->e_mbd).lossless[*(ushort *)&pMVar1->field_0xa7 & 7];
  uVar2 = 1;
  if ((pMVar1->field_0xa7 & 0x80) == 0) {
    uVar2 = (uint)('\0' < pMVar1->ref_frame[0]);
  }
  uVar3 = (ulong)tx_size;
  if ((0x61810UL >> (uVar3 & 0x3f) & 1) == 0) {
    if ((0x18608UL >> (uVar3 & 0x3f) & 1) == 0) {
      if ((cm->features).reduced_tx_set_used == false) {
        uVar2 = (uint)av1_ext_tx_set_lookup[0]
                      [(ulong)((0x60604UL >> (uVar3 & 0x3f) & 1) != 0) + (ulong)(uVar2 * 2)];
      }
      else {
        uVar2 = (uint)(byte)((uVar2 == 0) + 1);
      }
    }
  }
  else {
    uVar2 = 0;
  }
  txfm_param->tx_set_type = (TxSetType)uVar2;
  txfm_param->bd = (x->e_mbd).bd;
  txfm_param->is_hbd = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
  return;
}

Assistant:

void av1_setup_xform(const AV1_COMMON *cm, MACROBLOCK *x, TX_SIZE tx_size,
                     TX_TYPE tx_type, TxfmParam *txfm_param) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];

  txfm_param->tx_type = tx_type;
  txfm_param->tx_size = tx_size;
  txfm_param->lossless = xd->lossless[mbmi->segment_id];
  txfm_param->tx_set_type = av1_get_ext_tx_set_type(
      tx_size, is_inter_block(mbmi), cm->features.reduced_tx_set_used);

  txfm_param->bd = xd->bd;
  txfm_param->is_hbd = is_cur_buf_hbd(xd);
}